

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factor.h
# Opt level: O1

ostream * libDAI::operator<<(ostream *os,TFactor<double> *P)

{
  pointer pdVar1;
  ostream *poVar2;
  ulong uVar3;
  pointer n;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"(",1);
  for (n = (P->_vs)._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
           super__Vector_impl_data._M_start;
      n != (P->_vs)._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
           super__Vector_impl_data._M_finish; n = n + 1) {
    operator<<(os,n);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os," <",2);
  pdVar1 = (P->_p)._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((P->_p)._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_finish != pdVar1) {
    uVar3 = 0;
    do {
      poVar2 = std::ostream::_M_insert<double>(pdVar1[uVar3]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
      uVar3 = uVar3 + 1;
      pdVar1 = (P->_p)._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar3 < (ulong)((long)(P->_p)._p.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_finish - (long)pdVar1 >> 3));
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,">)",2);
  return os;
}

Assistant:

std::ostream& operator<< (std::ostream& os, const TFactor<T>& P) {
        os << "(" << P.vars() << " <";
        for( size_t i = 0; i < P._p.size(); i++ )
            os << P._p[i] << " ";
        os << ">)";
        return os;
    }